

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O2

uint GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_14>
     ::Run(uint *a,uint *b)

{
  uint uVar1;
  long in_FS_OFFSET;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = (int)*a >> 0x1f & 0x8dU ^ *a * 2;
  uVar1 = GFMulHelper<unsigned_int,_32,_LFSR<BitsInt<unsigned_int,_32>,_141U>,_BitsInt<unsigned_int,_32>,_13>
          ::Run(&local_1c,b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)(*b << 0xd) >> 0x1f & *a ^ uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static inline constexpr I Run(const I& a, const I& b) { return F::CondXorWith(GFMulHelper<I, N, L, F, K - 1>::Run(L::Call(a), b), F::template MidBits<N - K, 1>(b), a); }